

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O3

void __thiscall
st_tree::detail::
node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
::_erase(node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
         *this)

{
  tree_type *ptVar1;
  node_type *pnVar2;
  node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
  *this_00;
  iterator local_28;
  
  if (this->_parent == (node_type *)0x0) {
    ptVar1 = this->_tree;
    pnVar2 = ptVar1->_root;
    if (pnVar2 != (node_type *)0x0) {
      (**(pnVar2->
         super_node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
         )._vptr_node_base)(pnVar2);
      operator_delete(pnVar2,0x88);
      ptVar1->_root = (node_type *)0x0;
    }
  }
  else {
    this_00 = &parent(this)->
               super_node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
    ;
    local_28._base._M_node =
         (_Base_ptr)
         node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>
         ::_cs_iterator((node_type *)this);
    local_28._vptr_valmap_iterator_adaptor_forward =
         (_func_int **)&PTR__valmap_iterator_adaptor_forward_0030d300;
    _erase(this_00,&local_28);
  }
  return;
}

Assistant:

void _erase() {
        if (is_root()) _tree->erase();
        else parent().erase(_iterator());
    }